

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

string * __thiscall
EthUdpPort::IP_String_abi_cxx11_(string *__return_storage_ptr__,EthUdpPort *this,uint32_t IPaddr)

{
  allocator<char> local_2d;
  uint32_t IPaddr_local;
  char IPstr [16];
  
  IPaddr_local = (uint32_t)this;
  inet_ntop(2,&IPaddr_local,IPstr,0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,IPstr,&local_2d);
  return __return_storage_ptr__;
}

Assistant:

std::string EthUdpPort::IP_String(uint32_t IPaddr)
{
    char IPstr[INET_ADDRSTRLEN];
#ifdef _MSC_VER
    // Windows does not provide inet_ntop prior to Vista, so we use inet_ntoa.
    strncpy(IPstr, inet_ntoa(*reinterpret_cast<const struct in_addr *>(&IPaddr)), INET_ADDRSTRLEN);
#else
    inet_ntop(AF_INET, reinterpret_cast<const struct in_addr *>(&IPaddr), IPstr, INET_ADDRSTRLEN);
#endif
    return std::string(IPstr);
}